

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  GLFWwindow *handle;
  char *pcVar6;
  uint *__s1;
  ulong uVar7;
  char *args [3];
  char *local_48;
  char *local_40;
  undefined8 local_38;
  
  if (argc < 2) {
    fprintf(_stdout,"%s\n","parent");
    fflush(_stdout);
    local_48 = *argv;
    local_40 = "-child";
    local_38 = 0;
    iVar5 = execute(&local_48);
  }
  else {
    uVar7 = 1;
    do {
      __s1 = (uint *)argv[uVar7];
      iVar5 = strcmp((char *)__s1,"-child");
      if (iVar5 != 0) {
        main_cold_1();
        if ((*(long *)(__s1 + 10) != 0) &&
           ((*__s1 == 0 || (*(int *)(*(long *)(__s1 + 10) + 0x200) == 0)))) {
          iVar5 = 0x1000a;
          pcVar6 = (char *)0x0;
          goto LAB_00107e0f;
        }
        uVar7 = (ulong)__s1[1];
        if (__s1[1] - 0x36001 < 3) {
          uVar1 = *__s1;
          uVar7 = (ulong)uVar1;
          if (uVar1 == 0) goto LAB_00107ef5;
          if (uVar1 == 0x30001) {
            uVar1 = __s1[2];
            uVar2 = __s1[3];
            if ((-1 < (int)uVar2 && 0 < (int)uVar1) && (uVar1 != 1 || uVar2 < 6)) {
              if (uVar1 == 3) {
                bVar4 = 1;
                if (uVar2 < 4) goto LAB_00107ea2;
              }
              else if ((uVar1 != 2) || (uVar2 < 2)) {
                bVar4 = 0;
LAB_00107ea2:
                uVar3 = __s1[7];
                if (uVar3 - 0x32001 < 2) {
                  if (!(bool)(2 < uVar1 & (bVar4 ^ 1 | 1 < uVar2))) {
                    pcVar6 = "Context profiles are only defined for OpenGL version 3.2 and above";
LAB_00107ee9:
                    iVar5 = 0x10004;
LAB_00107e0f:
                    _glfwInputError(iVar5,pcVar6);
                    return 0;
                  }
                }
                else {
                  if (uVar3 != 0) {
                    pcVar6 = "Invalid OpenGL profile 0x%08X";
                    uVar7 = (ulong)uVar3;
                    goto LAB_00107e29;
                  }
                  if ((uVar1 < 3) && (__s1[4] != 0)) {
                    pcVar6 = 
                    "Forward-compatibility is only defined for OpenGL version 3.0 and above";
                    goto LAB_00107ee9;
                  }
                }
LAB_00107ef5:
                uVar1 = __s1[8];
                uVar7 = (ulong)uVar1;
                if ((uVar1 - 0x31001 < 2) || (uVar1 == 0)) {
                  uVar1 = __s1[9];
                  uVar7 = (ulong)uVar1;
                  if (uVar1 - 0x35001 < 2) {
                    return 1;
                  }
                  if (uVar1 == 0) {
                    return 1;
                  }
                  pcVar6 = "Invalid context release behavior 0x%08X";
                }
                else {
                  pcVar6 = "Invalid context robustness mode 0x%08X";
                }
                goto LAB_00107e29;
              }
            }
            pcVar6 = "Invalid OpenGL version %i.%i";
          }
          else {
            if (uVar1 != 0x30002) {
              pcVar6 = "Invalid client API 0x%08X";
              goto LAB_00107e29;
            }
            uVar1 = __s1[2];
            uVar2 = __s1[3];
            if (((-1 < (int)uVar2 && 0 < (int)uVar1) && (uVar1 != 1 || uVar2 < 2)) &&
               (uVar2 == 0 || uVar1 != 2)) goto LAB_00107ef5;
            pcVar6 = "Invalid OpenGL ES version %i.%i";
          }
          _glfwInputError(0x10004,pcVar6);
        }
        else {
          pcVar6 = "Invalid context creation API 0x%08X";
LAB_00107e29:
          _glfwInputError(0x10003,pcVar6,uVar7);
        }
        return 0;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
    iVar5 = 0;
    fprintf(_stdout,"%s\n","child");
    fflush(_stdout);
    glfwInit();
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      iVar5 = 0x7d;
    }
    else {
      glfwMakeContextCurrent(handle);
      glFlush();
      glfwDestroyWindow(handle);
      glfwTerminate();
    }
  }
  return iVar5;
}

Assistant:

int
main(int argc, char **argv)
{
    GLboolean child = GL_FALSE;
    int i;

    for (i = 1; i < argc; ++i) {
        const char *arg = argv[i];
        if (strcmp(arg, "-child") == 0) {
            child = GL_TRUE;
        } else {
            fprintf(stderr, "error: unknown arg %s\n", arg);
            exit(1);
        }
    }

    fprintf(stdout, "%s\n", child ? "child" : "parent");
    fflush(stdout);

    if (child) {
        GLFWwindow* window = NULL;

        glfwInit();

        glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

        window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
        if (!window) {
             return EXIT_SKIP;
        }

        glfwMakeContextCurrent(window);

        glFlush();

        glfwDestroyWindow(window);
        glfwTerminate();

        return 0;
    } else {
        const char *args[3];

        args[0] = argv[0];
        args[1] = "-child";
        args[2] = NULL;
        return execute((char * const *)args);
    }
}